

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# examples.h
# Opt level: O0

void rengine::animation_rotateZ(AnimationManager *manager,TransformNode *node,float duration)

{
  element_type *peVar1;
  float *pfVar2;
  shared_ptr<rengine::AbstractAnimation> local_50 [2];
  undefined1 local_30 [8];
  shared_ptr<rengine::Animation<rengine::TransformNode,_float,_&rengine::TransformNode::setMatrix_rotateAroundZ,_&rengine::AnimationCurves::linear>_>
  anim;
  float duration_local;
  TransformNode *node_local;
  AnimationManager *manager_local;
  
  anim.
  super___shared_ptr<rengine::Animation<rengine::TransformNode,_float,_&rengine::TransformNode::setMatrix_rotateAroundZ,_&rengine::AnimationCurves::linear>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi._4_4_ = duration;
  std::
  make_shared<rengine::Animation<rengine::TransformNode,float,&rengine::TransformNode::setMatrix_rotateAroundZ,&rengine::AnimationCurves::linear>,rengine::TransformNode*&>
            ((TransformNode **)local_30);
  peVar1 = std::
           __shared_ptr_access<rengine::Animation<rengine::TransformNode,_float,_&rengine::TransformNode::setMatrix_rotateAroundZ,_&rengine::AnimationCurves::linear>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<rengine::Animation<rengine::TransformNode,_float,_&rengine::TransformNode::setMatrix_rotateAroundZ,_&rengine::AnimationCurves::linear>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_30);
  AbstractAnimation::setDuration
            (&peVar1->super_AbstractAnimation,
             (double)anim.
                     super___shared_ptr<rengine::Animation<rengine::TransformNode,_float,_&rengine::TransformNode::setMatrix_rotateAroundZ,_&rengine::AnimationCurves::linear>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi._4_4_);
  peVar1 = std::
           __shared_ptr_access<rengine::Animation<rengine::TransformNode,_float,_&rengine::TransformNode::setMatrix_rotateAroundZ,_&rengine::AnimationCurves::linear>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<rengine::Animation<rengine::TransformNode,_float,_&rengine::TransformNode::setMatrix_rotateAroundZ,_&rengine::AnimationCurves::linear>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_30);
  AbstractAnimation::setIterations(&peVar1->super_AbstractAnimation,-1);
  peVar1 = std::
           __shared_ptr_access<rengine::Animation<rengine::TransformNode,_float,_&rengine::TransformNode::setMatrix_rotateAroundZ,_&rengine::AnimationCurves::linear>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<rengine::Animation<rengine::TransformNode,_float,_&rengine::TransformNode::setMatrix_rotateAroundZ,_&rengine::AnimationCurves::linear>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_30);
  pfVar2 = Animation<rengine::TransformNode,_float,_&rengine::TransformNode::setMatrix_rotateAroundZ,_&rengine::AnimationCurves::linear>
           ::newKeyFrame(peVar1,0.0);
  *pfVar2 = 0.0;
  peVar1 = std::
           __shared_ptr_access<rengine::Animation<rengine::TransformNode,_float,_&rengine::TransformNode::setMatrix_rotateAroundZ,_&rengine::AnimationCurves::linear>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<rengine::Animation<rengine::TransformNode,_float,_&rengine::TransformNode::setMatrix_rotateAroundZ,_&rengine::AnimationCurves::linear>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_30);
  pfVar2 = Animation<rengine::TransformNode,_float,_&rengine::TransformNode::setMatrix_rotateAroundZ,_&rengine::AnimationCurves::linear>
           ::newKeyFrame(peVar1,1.0);
  *pfVar2 = 6.2831855;
  std::shared_ptr<rengine::AbstractAnimation>::
  shared_ptr<rengine::Animation<rengine::TransformNode,float,&rengine::TransformNode::setMatrix_rotateAroundZ,&rengine::AnimationCurves::linear>,void>
            (local_50,(shared_ptr<rengine::Animation<rengine::TransformNode,_float,_&rengine::TransformNode::setMatrix_rotateAroundZ,_&rengine::AnimationCurves::linear>_>
                       *)local_30);
  AnimationManager::start(manager,local_50,0.0);
  std::shared_ptr<rengine::AbstractAnimation>::~shared_ptr(local_50);
  std::
  shared_ptr<rengine::Animation<rengine::TransformNode,_float,_&rengine::TransformNode::setMatrix_rotateAroundZ,_&rengine::AnimationCurves::linear>_>
  ::~shared_ptr((shared_ptr<rengine::Animation<rengine::TransformNode,_float,_&rengine::TransformNode::setMatrix_rotateAroundZ,_&rengine::AnimationCurves::linear>_>
                 *)local_30);
  return;
}

Assistant:

inline void animation_rotateZ(AnimationManager *manager, TransformNode *node, float duration)
{
    auto anim = std::make_shared<Animation_aroundZ_linear>(node);
    anim->setDuration(duration);
    anim->setIterations(-1);
    anim->newKeyFrame(0) = 0;
    anim->newKeyFrame(1) = M_PI * 2;
    manager->start(anim);
}